

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixy-fwd.c
# Opt level: O1

int main(int argc,char **argv)

{
  ixy_device *dev;
  ixy_device *dev_00;
  uint64_t uVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  ixy_device *extraout_RDX;
  ixy_device *tx_dev;
  ixy_device *tx_dev_00;
  ixy_device *extraout_RDX_00;
  ixy_device *extraout_RDX_01;
  ixy_device *extraout_RDX_02;
  ixy_device *extraout_RDX_03;
  ulong nanos;
  ulong uVar4;
  device_stats stats2_old;
  device_stats stats1_old;
  device_stats stats2;
  device_stats stats1;
  device_stats local_d8;
  device_stats local_a8;
  device_stats local_80;
  device_stats local_58;
  
  if (argc != 3) {
    printf("%s forwards packets between two ports.\n",*argv);
    printf("Usage: %s <pci bus id2> <pci bus id1>\n",*argv);
    return 1;
  }
  dev = ixy_init(argv[1],1,1,-1);
  uVar3 = 0;
  dev_00 = ixy_init(argv[2],1,1,0);
  uVar1 = monotonic_time();
  stats_init(&local_58,dev);
  stats_init(&local_a8,dev);
  stats_init(&local_80,dev_00);
  stats_init(&local_d8,dev_00);
  uVar4 = 0;
  tx_dev = extraout_RDX;
  do {
    while( true ) {
      forward(dev,(uint16_t)dev_00,tx_dev,(uint16_t)uVar3);
      forward(dev_00,(uint16_t)dev,tx_dev_00,(uint16_t)uVar3);
      tx_dev = extraout_RDX_00;
      if ((uVar4 & 0xfff) == 0) break;
LAB_00104966:
      uVar4 = uVar4 + 1;
    }
    uVar2 = monotonic_time();
    nanos = uVar2 - uVar1;
    tx_dev = extraout_RDX_01;
    if (nanos < 0x3b9aca01) goto LAB_00104966;
    (*dev->read_stats)(dev,&local_58);
    print_stats_diff(&local_58,&local_a8,nanos);
    uVar4 = uVar4 + 1;
    local_a8.tx_bytes = local_58.tx_bytes;
    local_a8.device = local_58.device;
    local_a8.rx_pkts = local_58.rx_pkts;
    local_a8.tx_pkts = local_58.tx_pkts;
    local_a8.rx_bytes = local_58.rx_bytes;
    tx_dev = extraout_RDX_02;
    uVar1 = uVar2;
    if (dev != dev_00) {
      (*dev_00->read_stats)(dev_00,&local_80);
      print_stats_diff(&local_80,&local_d8,nanos);
      tx_dev = extraout_RDX_03;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc != 3) {
		printf("%s forwards packets between two ports.\n", argv[0]);
		printf("Usage: %s <pci bus id2> <pci bus id1>\n", argv[0]);
		return 1;
	}

	struct ixy_device* dev1 = ixy_init(argv[1], 1, 1, -1);
	struct ixy_device* dev2 = ixy_init(argv[2], 1, 1, 0);

	uint64_t last_stats_printed = monotonic_time();
	struct device_stats stats1, stats1_old;
	struct device_stats stats2, stats2_old;
	stats_init(&stats1, dev1);
	stats_init(&stats1_old, dev1);
	stats_init(&stats2, dev2);
	stats_init(&stats2_old, dev2);

	uint64_t counter = 0;
	while (true) {
		forward(dev1, 0, dev2, 0);
		forward(dev2, 0, dev1, 0);

		// don't poll the time unnecessarily
		if ((counter++ & 0xFFF) == 0) {
			uint64_t time = monotonic_time();
			if (time - last_stats_printed > 1000 * 1000 * 1000) {
				// every second
				ixy_read_stats(dev1, &stats1);
				print_stats_diff(&stats1, &stats1_old, time - last_stats_printed);
				stats1_old = stats1;
				if (dev1 != dev2) {
					ixy_read_stats(dev2, &stats2);
					print_stats_diff(&stats2, &stats2_old, time - last_stats_printed);
					stats2_old = stats2;
				}
				last_stats_printed = time;
			}
		}
	}
}